

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_import::run_impl(statement_import *this)

{
  pointer ppVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  *val;
  pointer name;
  
  ppVar1 = (this->m_var_list).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (name = (this->m_var_list).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
              ._M_impl.super__Vector_impl_data._M_start; name != ppVar1; name = name + 1) {
    domain_manager::add_var_no_return<std::__cxx11::string&>
              (&(((((this->super_statement_base).context.
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage,&name->first,&name->second,true);
  }
  return;
}

Assistant:

void statement_import::run_impl()
	{
		for (auto &val: m_var_list)
			context->instance->storage.add_var_no_return(val.first, val.second, true);
	}